

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::CenterZoomNet(BoardView *this,string *netname)

{
  element_type *peVar1;
  _func_int **pp_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  _Var5;
  shared_ptr<Component> *extraout_RAX;
  element_type *peVar6;
  float fVar9;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  if ((this->config).infoPanelCenterZoomNets == true) {
    iVar3 = (*this->m_board->_vptr_Board[4])();
    _Var5._M_current = (shared_ptr<Component> *)CONCAT44(extraout_var,iVar3);
    peVar6 = ((_Var5._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar1 = (element_type *)
             ((_Var5._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    auVar11 = _DAT_001ec610;
    auVar16 = _DAT_001ec600;
    if (peVar6 != peVar1) {
      do {
        pp_Var2 = (peVar6->super_BoardElement)._vptr_BoardElement;
        _Var5._M_current = (shared_ptr<Component> *)pp_Var2[0xc];
        __n = _Var5._M_current[1].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
        if (__n == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)netname->_M_string_length) {
          if (__n != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uVar4 = bcmp(_Var5._M_current[1].
                         super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (netname->_M_dataplus)._M_p,(size_t)__n);
            _Var5._M_current = (shared_ptr<Component> *)(ulong)uVar4;
            if (uVar4 != 0) goto LAB_0011476f;
          }
          auVar15._8_8_ = 0;
          auVar15._0_8_ = pp_Var2[10];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = pp_Var2[10];
          auVar11 = minps(auVar13,auVar11);
          auVar16 = maxps(auVar15,auVar16);
          if ((((this->config).infoPanelSelectPartsOnNet == true) &&
              (*(int *)((long)pp_Var2 + 0xc) != 4)) &&
             (_Var5 = std::
                      __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Component>const>>
                                ((this->m_partHighlighted).
                                 super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (this->m_partHighlighted).
                                 super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,pp_Var2 + 0xd),
             _Var5._M_current ==
             (this->m_partHighlighted).
             super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            pp_Var2 = (peVar6->super_BoardElement)._vptr_BoardElement;
            pp_Var2[0xd][0xe0] = (code)0x1;
            std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
            push_back(&this->m_partHighlighted,(value_type *)(pp_Var2 + 0xd));
            _Var5._M_current = extraout_RAX;
          }
        }
LAB_0011476f:
        peVar6 = (element_type *)&peVar6->component_type;
      } while (peVar6 != peVar1);
    }
    fVar12 = auVar11._0_4_;
    fVar14 = auVar11._4_4_;
    auVar8._4_4_ = -(uint)(fVar14 == 3.4028235e+38);
    auVar8._0_4_ = -(uint)(fVar12 == 3.4028235e+38);
    auVar8._8_4_ = -(uint)(auVar16._0_4_ == 1.1754944e-38);
    auVar8._12_4_ = -(uint)(auVar16._4_4_ == 1.1754944e-38);
    iVar3 = movmskps((int)_Var5._M_current,auVar8);
    if (iVar3 == 0) {
      if (this->debug == true) {
        CenterZoomNet();
      }
      auVar17._0_4_ = auVar16._0_4_ - fVar12;
      auVar17._4_4_ = auVar16._4_4_ - fVar14;
      auVar17._8_4_ = auVar16._8_4_ - auVar11._8_4_;
      auVar17._12_4_ = auVar16._12_4_ - auVar11._12_4_;
      auVar11._8_8_ = 0;
      auVar11._0_4_ = (this->m_board_surface).x;
      auVar11._4_4_ = (this->m_board_surface).y;
      auVar11 = divps(auVar11,auVar17);
      fVar10 = (float)(~-(uint)(0.0 < auVar17._0_4_) & 0x7f7fffff |
                      auVar11._0_4_ & -(uint)(0.0 < auVar17._0_4_));
      fVar9 = (float)(~-(uint)(0.0 < auVar17._4_4_) & 0x7f7fffff |
                     auVar11._4_4_ & -(uint)(0.0 < auVar17._4_4_));
      if (fVar9 <= fVar10) {
        fVar10 = fVar9;
      }
      this->m_scale = fVar10;
      if ((fVar10 == 3.4028235e+38) && (!NAN(fVar10))) {
        this->m_scale = this->m_scale_floor;
      }
      fVar10 = this->m_scale / (this->config).partZoomScaleOutFactor;
      this->m_scale = fVar10;
      if (fVar10 < this->m_scale_floor) {
        this->m_scale = this->m_scale_floor;
      }
      fVar10 = (this->m_board_surface).x;
      fVar9 = (this->m_board_surface).y;
      fVar12 = fVar12 + auVar17._0_4_ * 0.5;
      fVar14 = fVar14 + auVar17._4_4_ * 0.5;
      this->m_dx = fVar12;
      this->m_dy = fVar14;
      IVar7 = ScreenToCoord(this,fVar10 * 0.5,fVar9 * 0.5,1.0);
      this->m_dx = (IVar7.x - fVar12) + fVar12;
      this->m_dy = (IVar7.y - fVar14) + fVar14;
      this->m_needsRedraw = true;
    }
  }
  return;
}

Assistant:

void BoardView::CenterZoomNet(std::string netname) {
	ImVec2 view = m_board_surface;
	ImVec2 min, max;
	int i = 0;

	if (!config.infoPanelCenterZoomNets) return;

	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;

	for (auto &pin : m_board->Pins()) {
		if (pin->net->name == netname) {
			auto p = pin->position;
			if (p.x < min.x) min.x = p.x;
			if (p.y < min.y) min.y = p.y;
			if (p.x > max.x) max.x = p.x;
			if (p.y > max.y) max.y = p.y;

			if ((config.infoPanelSelectPartsOnNet) && (pin->type != Pin::kPinTypeTestPad)) {
				if (!contains(pin->component, m_partHighlighted)) {
					pin->component->visualmode = pin->component->CVMSelected;
					m_partHighlighted.push_back(pin->component);
				}
			}
		}
	}

	// Bounds check!
	if ((min.x == FLT_MAX) || (min.y == FLT_MAX) || (max.x == FLT_MIN) || (max.y == FLT_MIN)) return;

	if (debug) fprintf(stderr, "CenterzoomNet: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);

	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : FLT_MAX;
	float sy = dy > 0 ? view.y / dy : FLT_MAX;

	m_scale = sx < sy ? sx : sy;
	if (m_scale == FLT_MAX) m_scale = m_scale_floor;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;

	/*
	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	//  m_rotation = 0;
	m_scale = sx < sy ? sx : sy;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;
	*/

	m_dx = (max.x - min.x) / 2 + min.x;
	m_dy = (max.y - min.y) / 2 + min.y;
	SetTarget(m_dx, m_dy);
	m_needsRedraw = true;
}